

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void Memory::Recycler::WBSetBit(char *addr)

{
  Recycler *this;
  HeapBlock *pHVar1;
  Recycler **ppRVar2;
  AutoCriticalSection local_28;
  AutoCriticalSection lock;
  
  if ((DAT_0145c43e == '\x01') && (DAT_0145c43f == '\x01')) {
    local_28.cs = &recyclerListLock;
    CCLock::Enter(&recyclerListLock.super_CCLock);
    ppRVar2 = &recyclerList;
    do {
      this = *ppRVar2;
      if (this == (Recycler *)0x0) goto LAB_0068a6fa;
      pHVar1 = FindHeapBlock(this,(void *)((ulong)addr & 0xfffffffffffffff0));
      ppRVar2 = &this->next;
    } while (pHVar1 == (HeapBlock *)0x0);
    (**pHVar1->_vptr_HeapBlock)(pHVar1,addr);
LAB_0068a6fa:
    AutoCriticalSection::~AutoCriticalSection(&local_28);
  }
  return;
}

Assistant:

void
Recycler::WBSetBit(char* addr)
{
    if (CONFIG_FLAG(ForceSoftwareWriteBarrier) && CONFIG_FLAG(VerifyBarrierBit))
    {
        AutoCriticalSection lock(&recyclerListLock);
        Recycler* recycler = Recycler::recyclerList;
        while (recycler)
        {
            auto heapBlock = recycler->FindHeapBlock((void*)((UINT_PTR)addr&~HeapInfo::ObjectAlignmentMask));
            if (heapBlock)
            {
                heapBlock->WBSetBit(addr);
                break;
            }
            recycler = recycler->next;
        }
    }
}